

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O1

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,char *str,qsizetype len,qsizetype from)

{
  ulong uVar1;
  uchar *puVar2;
  bool bVar3;
  long lVar4;
  qsizetype qVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  char cVar12;
  long lVar13;
  byte *unaff_R13;
  
  lVar7 = 0;
  if (0 < from) {
    lVar7 = from;
  }
  uVar1 = (this->field_2).p.l;
  if (uVar1 == 0) {
    qVar5 = -1;
    if (lVar7 <= len) {
      qVar5 = lVar7;
    }
    return qVar5;
  }
  puVar2 = (this->field_2).p.p;
  pbVar11 = (byte *)(str + uVar1 + lVar7 + -1);
  pbVar6 = (byte *)(str + len);
  do {
    if (pbVar6 <= pbVar11) {
      return -1;
    }
    uVar8 = (ulong)*(byte *)((long)&this->field_2 + (ulong)*pbVar11);
    if (uVar8 == 0) {
      if ((long)uVar1 < 1) {
        lVar7 = 0;
      }
      else {
        bVar9 = *pbVar11;
        if (bVar9 == puVar2[uVar1 - 1]) {
          lVar13 = 0;
          do {
            lVar7 = -uVar1;
            if (1 - uVar1 == lVar13) goto LAB_0030c45c;
            bVar9 = pbVar11[lVar13 + -1];
            lVar7 = lVar13 + -1;
            lVar4 = lVar13 + (uVar1 - 2);
            lVar13 = lVar7;
          } while (bVar9 == puVar2[lVar4]);
          lVar13 = -lVar7;
          bVar3 = lVar13 < (long)uVar1;
        }
        else {
          lVar13 = 0;
          lVar7 = 0;
          bVar3 = 0 < (long)uVar1;
        }
        if (bVar3) {
          uVar8 = uVar1 - lVar13;
          if (uVar1 != *(byte *)((long)&this->field_2 + (ulong)bVar9)) {
            uVar8 = 1;
          }
          goto LAB_0030c3c2;
        }
      }
LAB_0030c45c:
      unaff_R13 = pbVar11 + (lVar7 - (long)str) + 1;
      cVar12 = '\x01';
    }
    else {
LAB_0030c3c2:
      uVar10 = 0;
      if (pbVar11 <= pbVar6 + -uVar8) {
        uVar10 = uVar8;
      }
      bVar3 = pbVar6 + -uVar8 < pbVar11;
      pbVar11 = pbVar11 + uVar10;
      cVar12 = bVar3 * '\x03';
    }
    if (cVar12 != '\0') {
      pbVar6 = (byte *)0xffffffffffffffff;
      if (cVar12 != '\x03') {
        pbVar6 = unaff_R13;
      }
      return (qsizetype)pbVar6;
    }
  } while( true );
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(const char *str, qsizetype len, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(str), len, from,
                   p.p, p.l, p.q_skiptable);
}